

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int archive_read_format_rar_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  long lVar1;
  byte *pbVar2;
  int iVar3;
  size_t in_RAX;
  void *pvVar4;
  undefined8 uVar5;
  long lVar6;
  char *fmt;
  size_t local_38;
  
  pvVar4 = a->format->data;
  if (*(int *)((long)pvVar4 + 0x4ee8) == -1) {
    *(undefined4 *)((long)pvVar4 + 0x4ee8) = 0;
  }
  local_38 = in_RAX;
  if (0 < *(long *)((long)pvVar4 + 0x98)) {
    __archive_read_consume(a,*(long *)((long)pvVar4 + 0x98));
    *(undefined8 *)((long)pvVar4 + 0x98) = 0;
  }
  if ((*(char *)((long)pvVar4 + 0xe5) == '\0') &&
     (*(long *)((long)pvVar4 + 0xc0) < *(long *)((long)pvVar4 + 0x28))) {
    if (*(byte *)((long)pvVar4 + 0x17) - 0x31 < 5) {
      iVar3 = read_data_compressed(a,buff,size,offset);
      if (iVar3 == -0x14) {
        return -0x14;
      }
      if (iVar3 == 0) {
        return 0;
      }
      Ppmd7_Free((CPpmd7 *)((long)pvVar4 + 0x370),&g_szalloc);
      return iVar3;
    }
    if (*(byte *)((long)pvVar4 + 0x17) == 0x30) {
      pbVar2 = (byte *)a->format->data;
      if ((*(long *)(pbVar2 + 0xa0) == 0) && (((*pbVar2 & 1) == 0 || ((pbVar2[0x18] & 2) == 0)))) {
        *buff = (void *)0x0;
        *size = 0;
        *offset = *(int64_t *)(pbVar2 + 0xb0);
        if (*(long *)(pbVar2 + 8) == *(long *)(pbVar2 + 0xe8)) {
          pbVar2[0xe5] = 1;
          goto LAB_00130953;
        }
        fmt = "File CRC error";
      }
      else {
        pvVar4 = rar_read_ahead(a,1,(ssize_t *)&local_38);
        *buff = pvVar4;
        if (0 < (long)local_38) {
          *size = local_38;
          *offset = *(int64_t *)(pbVar2 + 0xb0);
          *(size_t *)(pbVar2 + 0xb0) = *(long *)(pbVar2 + 0xb0) + local_38;
          *(size_t *)(pbVar2 + 0xc0) = *(long *)(pbVar2 + 0xc0) + local_38;
          *(size_t *)(pbVar2 + 0xa0) = *(long *)(pbVar2 + 0xa0) - local_38;
          *(size_t *)(pbVar2 + 0x98) = local_38;
          uVar5 = crc32(*(undefined8 *)(pbVar2 + 0xe8),pvVar4);
          *(undefined8 *)(pbVar2 + 0xe8) = uVar5;
          return 0;
        }
        fmt = "Truncated RAR file data";
      }
    }
    else {
      fmt = "Unsupported compression method for RAR file.";
    }
    archive_set_error(&a->archive,0x54,fmt);
    iVar3 = -0x1e;
  }
  else {
    *buff = (void *)0x0;
    *size = 0;
    lVar1 = *(long *)((long)pvVar4 + 0xb0);
    *offset = lVar1;
    lVar6 = *(long *)((long)pvVar4 + 0x28);
    if (*(long *)((long)pvVar4 + 0x28) < lVar1) {
      lVar6 = lVar1;
    }
    *offset = lVar6;
LAB_00130953:
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int
archive_read_format_rar_read_data(struct archive_read *a, const void **buff,
                                  size_t *size, int64_t *offset)
{
  struct rar *rar = (struct rar *)(a->format->data);
  int ret;

  if (rar->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
	  rar->has_encrypted_entries = 0;
  }

  if (rar->bytes_unconsumed > 0) {
      /* Consume as much as the decompressor actually used. */
      __archive_read_consume(a, rar->bytes_unconsumed);
      rar->bytes_unconsumed = 0;
  }

  if (rar->entry_eof || rar->offset_seek >= rar->unp_size) {
    *buff = NULL;
    *size = 0;
    *offset = rar->offset;
    if (*offset < rar->unp_size)
      *offset = rar->unp_size;
    return (ARCHIVE_EOF);
  }

  switch (rar->compression_method)
  {
  case COMPRESS_METHOD_STORE:
    ret = read_data_stored(a, buff, size, offset);
    break;

  case COMPRESS_METHOD_FASTEST:
  case COMPRESS_METHOD_FAST:
  case COMPRESS_METHOD_NORMAL:
  case COMPRESS_METHOD_GOOD:
  case COMPRESS_METHOD_BEST:
    ret = read_data_compressed(a, buff, size, offset);
    if (ret != ARCHIVE_OK && ret != ARCHIVE_WARN)
      __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context, &g_szalloc);
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unsupported compression method for RAR file.");
    ret = ARCHIVE_FATAL;
    break;
  }
  return (ret);
}